

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

int LoadCkeyEkeySize(TCascStorage *param_1,char *param_2,char *szDataPtr,char *szDataEnd,
                    void *pvParam)

{
  int iVar1;
  char *pcVar2;
  DWORD ContentSize;
  DWORD local_c;
  
  local_c = 0;
  pcVar2 = CaptureDecimalInteger(szDataPtr,szDataEnd,&local_c);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 1000;
  }
  else {
    ConvertIntegerToBytes_4(local_c,(LPBYTE)((long)pvParam + 2));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int LoadCkeyEkeySize(TCascStorage * /* hs */, const char * /* szVariableName */, const char * szDataPtr, const char * szDataEnd, void * pvParam)
{
    PCASC_CKEY_ENTRY pCKeyEntry = (PCASC_CKEY_ENTRY)pvParam;
    DWORD ContentSize = 0;

    // Load the content size. The encoded size is ignored for now
    szDataPtr = CaptureDecimalInteger(szDataPtr, szDataEnd, &ContentSize);
    if(szDataPtr == NULL)
        return ERROR_BAD_FORMAT;

    // Convert the content size into the big-endian
    ConvertIntegerToBytes_4(ContentSize, pCKeyEntry->ContentSize);
    return ERROR_SUCCESS;
}